

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O0

long * boost::detail::multi_array::copy_n<long_const*,unsigned_long,long*>
                 (long *first,unsigned_long count,long *result)

{
  long *result_local;
  unsigned_long count_local;
  long *first_local;
  
  result_local = result;
  first_local = first;
  for (count_local = count; count_local != 0; count_local = count_local - 1) {
    *result_local = *first_local;
    first_local = first_local + 1;
    result_local = result_local + 1;
  }
  return result_local;
}

Assistant:

OutputIter copy_n(InputIter first, Size count,
                  OutputIter result) {
  for ( ; count > 0; --count) {
    *result = *first;
    ++first;
    ++result;
  }
  return result;
}